

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_EmbeddedFullDeletionTest_Test::TestBody
          (ComparisonTest_EmbeddedFullDeletionTest_Test *this)

{
  char *message;
  AssertHelper AStack_48;
  AssertionResult gtest_ar;
  string local_30;
  
  proto2_unittest::TestAllTypes::clear_optional_nested_message
            (&(this->super_ComparisonTest).proto2_);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_(&local_30,this);
  testing::internal::CmpHelperEQ<char[47],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"deleted: optional_nested_message: { bb: 118 }\\n\"","Run()",
             (char (*) [47])"deleted: optional_nested_message: { bb: 118 }\n",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd61,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, EmbeddedFullDeletionTest) {
  proto2_.clear_optional_nested_message();

  EXPECT_EQ("deleted: optional_nested_message: { bb: 118 }\n", Run());
}